

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  not_null<const_char_*> nVar2;
  bool bVar3;
  user_options *this_00;
  int iVar4;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  undefined8 *puVar5;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  long in_FS_OFFSET;
  thread watch_th;
  thread copy_th;
  thread quit_th;
  shared_ptr<pstore::database> src_db;
  string src_path;
  status st;
  user_options user_opt;
  string src_dir;
  thread local_110;
  thread local_108;
  access_mode local_100;
  undefined4 uStack_fc;
  shared_ptr<pstore::database> local_f8;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  undefined1 local_d8 [24];
  int local_c0;
  undefined2 local_b3;
  undefined1 local_b1;
  reference_wrapper<vacuum::user_options> local_b0;
  undefined1 local_a8 [8];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  string local_80;
  not_null<const_char_*> local_58;
  status *local_50;
  not_null<const_char_*> local_48;
  not_null<const_char_*> local_40;
  not_null<const_char_*> local_38;
  
  local_38.ptr_ = "main";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_38);
  pstore::threads::set_name(local_38);
  local_e8 = (undefined1  [8])local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"vacuumd","");
  pstore::create_log_stream((string *)local_e8);
  if (local_e8 != (undefined1  [8])local_d8) {
    operator_delete((void *)local_e8,local_d8._0_8_ + 1);
  }
  local_a8[0] = (string)0x0;
  local_98 = 0;
  local_90 = 0;
  local_a0 = &local_90;
  get_switches((pair<vacuum::user_options,_int> *)local_e8,argc,argv);
  local_a8[0] = local_e8[0];
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e0);
  if (local_e0._M_p != local_d8 + 8) {
    operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
  }
  iVar4 = local_c0;
  if (local_c0 == 0) {
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char*>((string *)local_e8,local_a0,local_a0 + local_98);
    pstore::path::posix::dir_name(&local_80,(string *)local_e8);
    local_40.ptr_ = (char *)local_e8;
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_40);
    nVar2.ptr_ = local_40.ptr_;
    pstore::details::log_destinations::__tls_init();
    if (*(long *)(in_FS_OFFSET + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar1 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
      for (puVar5 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar5 != puVar1;
          puVar5 = puVar5 + 1) {
        (**(code **)(*(long *)*puVar5 + 0x58))((long *)*puVar5,5,"Start ",nVar2.ptr_);
      }
    }
    local_100 = writable;
    local_110._M_id._M_thread = (id)((ulong)local_110._M_id._M_thread & 0xffffffffffffff00);
    local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (database *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstore::database,std::allocator<pstore::database>,std::__cxx11::string_const&,pstore::database::access_mode,bool>
              (&local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(database **)&local_f8,(allocator<pstore::database> *)&local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
               &local_100,(bool *)&local_110);
    local_b3 = 0;
    local_b1 = 0;
    create_quit_thread((status *)&local_100,(shared_ptr<pstore::database> *)&local_b3);
    this_00 = (user_options *)
              pstore::database::upgrade_to_write_lock
                        (local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    if (this_00 == (user_options *)0x0) {
      pstore::assert_failed
                ("0",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/vacuum/main.cpp"
                 ,0x7c);
    }
    bVar3 = std::unique_lock<pstore::file::range_lock>::try_lock
                      ((unique_lock<pstore::file::range_lock> *)this_00);
    if (bVar3) {
      local_48.ptr_ = "Got the file lock. No-one has the file open.";
      pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_48);
      nVar2.ptr_ = local_48.ptr_;
      pstore::details::log_destinations::__tls_init();
      if (*(long *)(in_FS_OFFSET + -8) != 0) {
        pstore::details::log_destinations::__tls_init();
        puVar1 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
        for (puVar5 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar5 != puVar1;
            puVar5 = puVar5 + 1) {
          (**(code **)(*(long *)*puVar5 + 0x48))((long *)*puVar5,6,nVar2.ptr_);
        }
      }
      std::unique_lock<pstore::file::range_lock>::unlock
                ((unique_lock<pstore::file::range_lock> *)this_00);
    }
    local_b0._M_data = (user_options *)local_a8;
    local_110._M_id._M_thread = (id)(id)&local_b3;
    std::thread::
    thread<void(&)(std::shared_ptr<pstore::database>,vacuum::status*,vacuum::user_options_const&),std::shared_ptr<pstore::database>&,vacuum::status*,std::reference_wrapper<vacuum::user_options>,void>
              (&local_108,vacuum::copy,&local_f8,(status **)&local_110,&local_b0);
    local_b0._M_data = this_00;
    local_50 = (status *)&local_b3;
    std::thread::
    thread<void(&)(std::shared_ptr<pstore::database>,std::unique_lock<pstore::file::range_lock>&,vacuum::status*),std::shared_ptr<pstore::database>&,std::reference_wrapper<std::unique_lock<pstore::file::range_lock>>,vacuum::status*,void>
              (&local_110,vacuum::watch,&local_f8,
               (reference_wrapper<std::unique_lock<pstore::file::range_lock>_> *)&local_b0,&local_50
              );
    this._M_pi = local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    std::thread::join();
    std::thread::join();
    notify_quit_thread();
    std::thread::join();
    local_58.ptr_ = (char *)local_e8;
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_58);
    nVar2.ptr_ = local_58.ptr_;
    pstore::details::log_destinations::__tls_init();
    if (*(long *)(in_FS_OFFSET + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar1 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
      for (puVar5 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar5 != puVar1;
          puVar5 = puVar5 + 1) {
        (**(code **)(*(long *)*puVar5 + 0x58))((long *)*puVar5,5,"main () exiting: ",nVar2.ptr_);
      }
    }
    if (((local_110._M_id._M_thread != 0) || (local_108._M_id._M_thread != 0)) ||
       (CONCAT44(uStack_fc,local_100) != 0)) {
      std::terminate();
    }
    if (local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != (undefined1  [8])local_d8) {
      operator_delete((void *)local_e8,local_d8._0_8_ + 1);
    }
    iVar4 = 0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return iVar4;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    using priority = pstore::logger::priority;
    PSTORE_TRY {
        pstore::threads::set_name ("main");
        pstore::create_log_stream ("vacuumd");

        vacuum::user_options user_opt;
        std::tie (user_opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

#if 0
        if (user_opt.daemon_mode) {
#    ifdef _WIN32
            if (::SetPriorityClass (::GetCurrentProcess (), PROCESS_MODE_BACKGROUND_BEGIN) == 0) {
                throw pstore::win32::exception ("SetPriorityClass", ::GetLastError ());
            }
#    else
            // Increase our "niceness" value to reduce the priority of the process.
            if (::setpriority (PRIO_PROCESS, 0, 7) == -1) {
                raise (pstore::errno_erc {errno}, "setpriority");
            }
            if (daemon (0 /*nochdir*/, 0 /*noclose*/) != 0) {
                raise (pstore::errno_erc {errno}, "daemon");
            }
#    endif
        }
#endif

        // bool const verbose = (options [verbose_opt] != nullptr);
        std::string const src_path = user_opt.src_path;
        std::string const src_dir = pstore::path::dir_name (src_path);

        log (priority::notice, "Start ", pstore::logger::quoted{src_path.c_str ()});

        // Superficially, we shouldn't need write access to the data store, but we do so because
        // once the collection is complete, we'll rename the temporary file that has been created
        // to the real file name that we're replacing. If the target file isn't writable, we
        // shouldn't try to replace it with the newer version.
        auto src_db = std::make_shared<pstore::database> (
            src_path, pstore::database::access_mode::writable, false /*access tick enabled*/);

        vacuum::status st;
        std::thread quit_th = create_quit_thread (st, src_db);

        std::unique_lock<pstore::file::range_lock> * file_lock = src_db->upgrade_to_write_lock ();
        if (file_lock == nullptr) {
            PSTORE_ASSERT (0);
        }

        if (file_lock->try_lock ()) {
            log (priority::info, "Got the file lock. No-one has the file open.");
            file_lock->unlock ();
        }

        std::thread copy_th (vacuum::copy, src_db, &st, std::ref (user_opt));
        std::thread watch_th (vacuum::watch, src_db, std::ref (*file_lock), &st);

        src_db.reset (); // main thread releases its reference to the source database.

        copy_th.join ();
        watch_th.join ();

        // We're done. Ask the quit thread to exit.
        notify_quit_thread ();
        quit_th.join ();

        // TODO:
        // On macOS we can do better than rename() [see man 2 exchangedata].
        // Similar elsewhere?

        log (priority::notice, "main () exiting: ", pstore::logger::quoted{src_path.c_str ()});
    }